

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O3

void __thiscall BoardView::Update(BoardView *this)

{
  BackgroundImage *this_00;
  KeyBindings *this_01;
  bool *v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  BRDFileBase *pBVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  Component *this_03;
  pointer pcVar7;
  pointer pcVar8;
  pointer pcVar9;
  ImVec2 IVar10;
  double dVar11;
  _Impl *p_Var12;
  _Impl *p_Var13;
  byte bVar14;
  bool bVar15;
  int iVar16;
  char *label;
  ImGuiIO *pIVar17;
  ImDrawList *draw;
  long lVar18;
  undefined1 auVar19 [8];
  char (*s) [2048];
  float fVar20;
  float fVar21;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  path filepath;
  char *preset_filename;
  undefined1 local_c0 [8];
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Impl *local_a0;
  undefined1 local_98 [32];
  _Impl *local_78;
  float local_6c;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  string local_58;
  char (*local_38) [2048];
  
  uStack_60 = local_68;
  local_38 = (char (*) [2048])0x0;
  local_68 = (undefined1  [8])ImGui::GetIO();
  if ((((ImGuiIO *)local_68)->DisplaySize).x <= 0.0) {
    return;
  }
  if ((((ImGuiIO *)local_68)->DisplaySize).y <= 0.0) {
    return;
  }
  local_c0 = (undefined1  [8])&local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Open","");
  this_01 = &this->keybindings;
  bVar14 = KeyBindings::isPressed(this_01,(string *)local_c0);
  if (local_c0 != (undefined1  [8])&local_b0) {
    operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
  }
  if ((bool)bVar14) {
    auVar19 = local_68;
    ImGuiIO::AddKeyEvent((ImGuiIO *)local_68,ImGuiKey_RightCtrl,false);
    ImGuiIO::AddKeyEvent((ImGuiIO *)auVar19,ImGuiKey_LeftCtrl,false);
    ImGuiIO::AddKeyEvent((ImGuiIO *)auVar19,ImGuiKey_O,false);
  }
  local_c0 = (undefined1  [8])&local_b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Quit","");
  bVar15 = KeyBindings::isPressed(this_01,(string *)local_c0);
  if (local_c0 != (undefined1  [8])&local_b0) {
    operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
  }
  if (bVar15) {
    this->m_wantsQuit = true;
  }
  bVar15 = ImGui::BeginMainMenuBar();
  if (bVar15) {
    fVar20 = ImGui::GetWindowHeight();
    this->m_menu_height = fVar20;
    SearchComponent(this);
    ContextMenu(this);
    bVar15 = ImGui::BeginMenu("File",true);
    if (bVar15) {
      local_98._0_8_ = (long)local_98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Open","");
      KeyBindings::getKeyNames((string *)local_c0,this_01,(string *)local_98);
      bVar15 = ImGui::MenuItem("Open",(char *)local_c0,false,true);
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (local_98._0_8_ != (long)local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      bVar14 = bVar15 || (bool)bVar14;
      ImGui::Separator();
      if (0 < (this->fhistory).count) {
        s = (this->fhistory).history;
        lVar18 = 0;
        do {
          label = FHistory::Trim_filename(&this->fhistory,*s,2);
          bVar15 = ImGui::MenuItem(label,(char *)0x0,false,true);
          if (bVar15) {
            bVar14 = true;
            local_38 = s;
          }
          lVar18 = lVar18 + 1;
          s = s + 1;
        } while (lVar18 < (this->fhistory).count);
      }
      ImGui::Separator();
      local_98._0_8_ = (long)local_98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Search","");
      KeyBindings::getKeyNames((string *)local_c0,this_01,(string *)local_98);
      bVar15 = ImGui::MenuItem("Part/Net Search",(char *)local_c0,false,true);
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (local_98._0_8_ != (long)local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if ((bVar15) && (this->m_validBoard == true)) {
        this->m_showSearch = true;
      }
      ImGui::Separator();
      Preferences::Program::menuItem(&this->programPreferences);
      Preferences::Color::menuItem(&this->colorPreferences);
      Preferences::Keyboard::menuItem(&this->keyboardPreferences);
      Preferences::BoardSettings::menuItem(&this->boardSettings);
      ImGui::Separator();
      local_98._0_8_ = (long)local_98 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Quit","");
      KeyBindings::getKeyNames((string *)local_c0,this_01,(string *)local_98);
      bVar15 = ImGui::MenuItem("Quit",(char *)local_c0,false,true);
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (local_98._0_8_ != (long)local_98 + 0x10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (bVar15) {
        this->m_wantsQuit = true;
      }
      ImGui::EndMenu();
    }
    bVar15 = ImGui::BeginMenu("View",true);
    if (bVar15) {
      IVar10 = (ImVec2)((long)local_98 + 0x10);
      local_98._0_8_ = IVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Flip","");
      KeyBindings::getKeyNames((string *)local_c0,this_01,(string *)local_98);
      bVar15 = ImGui::MenuItem("Flip board",(char *)local_c0,false,true);
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (bVar15) {
        FlipBoard(this,0);
      }
      local_98._0_8_ = IVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"RotateCW","");
      KeyBindings::getKeyNames((string *)local_c0,this_01,(string *)local_98);
      bVar15 = ImGui::MenuItem("Rotate CW",(char *)local_c0,false,true);
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (bVar15) {
        Rotate(this,1);
      }
      local_98._0_8_ = IVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"RotateCCW","");
      KeyBindings::getKeyNames((string *)local_c0,this_01,(string *)local_98);
      bVar15 = ImGui::MenuItem("Rotate CCW",(char *)local_c0,false,true);
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (bVar15) {
        Rotate(this,-1);
      }
      local_98._0_8_ = IVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Center","");
      KeyBindings::getKeyNames((string *)local_c0,this_01,(string *)local_98);
      bVar15 = ImGui::MenuItem("Reset View",(char *)local_c0,false,true);
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (bVar15) {
        CenterView(this);
      }
      local_98._0_8_ = IVar10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"Mirror","");
      KeyBindings::getKeyNames((string *)local_c0,this_01,(string *)local_98);
      bVar15 = ImGui::MenuItem("Mirror Board",(char *)local_c0,false,true);
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (bVar15) {
        Mirror(this);
      }
      ImGui::Separator();
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Show FPS","");
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      local_98._0_8_ = IVar10;
      bVar15 = MenuItemWithCheckbox
                         ((string *)local_c0,(string *)local_98,&(this->config).showFPS,true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (bVar15) {
        Confparse::WriteBool(&this->obvconfig,"showFPS",(this->config).showFPS);
      }
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Show position","");
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      local_98._0_8_ = IVar10;
      bVar15 = MenuItemWithCheckbox
                         ((string *)local_c0,(string *)local_98,&(this->config).showPosition,true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      local_6c = (float)CONCAT31(local_6c._1_3_,bVar14);
      if (bVar15) {
        Confparse::WriteBool(&this->obvconfig,"showPosition",(this->config).showPosition);
      }
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Show pins","");
      paVar1 = &local_58.field_2;
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"TogglePins","");
      KeyBindings::getKeyNames((string *)local_98,this_01,&local_58);
      bVar15 = MenuItemWithCheckbox
                         ((string *)local_c0,(string *)local_98,&(this->config).showPins,true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (bVar15) {
        Confparse::WriteBool(&this->obvconfig,"showPins",(this->config).showPins);
        this->m_needsRedraw = true;
      }
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Show net web","");
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      local_98._0_8_ = IVar10;
      bVar15 = MenuItemWithCheckbox
                         ((string *)local_c0,(string *)local_98,&(this->config).showNetWeb,true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (bVar15) {
        Confparse::WriteBool(&this->obvconfig,"showNetWeb",(this->config).showNetWeb);
        this->m_needsRedraw = true;
      }
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Show annotations","");
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      local_98._0_8_ = IVar10;
      bVar15 = MenuItemWithCheckbox
                         ((string *)local_c0,(string *)local_98,&(this->config).showAnnotations,true
                         );
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (bVar15) {
        Confparse::WriteBool(&this->obvconfig,"showAnnotations",(this->config).showAnnotations);
        this->m_needsRedraw = true;
      }
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Show parts name","");
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      local_98._0_8_ = IVar10;
      bVar15 = MenuItemWithCheckbox
                         ((string *)local_c0,(string *)local_98,&(this->config).showPartName,true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (bVar15) {
        Confparse::WriteBool(&this->obvconfig,"showPartName",(this->config).showPartName);
        this->m_needsRedraw = true;
      }
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Show pins name","");
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      local_98._0_8_ = IVar10;
      bVar15 = MenuItemWithCheckbox
                         ((string *)local_c0,(string *)local_98,&(this->config).showPinName,true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (bVar15) {
        Confparse::WriteBool(&this->obvconfig,"showPinName",(this->config).showPinName);
        this->m_needsRedraw = true;
      }
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Show background image","")
      ;
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      local_98._0_8_ = IVar10;
      bVar15 = MenuItemWithCheckbox
                         ((string *)local_c0,(string *)local_98,&(this->config).showBackgroundImage,
                          true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (bVar15) {
        Confparse::WriteBool
                  (&this->obvconfig,"showBackgroundImage",(this->config).showBackgroundImage);
        (this->backgroundImage).enabled = (this->config).showBackgroundImage;
      }
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Fill board","");
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      local_98._0_8_ = IVar10;
      bVar15 = MenuItemWithCheckbox
                         ((string *)local_c0,(string *)local_98,&(this->config).boardFill,true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (bVar15) {
        Confparse::WriteBool(&this->obvconfig,"boardFill",(this->config).boardFill);
        this->m_needsRedraw = true;
      }
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Fill parts","");
      local_98._8_8_ = 0;
      local_98[0x10] = '\0';
      local_98._0_8_ = IVar10;
      bVar15 = MenuItemWithCheckbox
                         ((string *)local_c0,(string *)local_98,&(this->config).fillParts,true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (bVar15) {
        Confparse::WriteBool(&this->obvconfig,"fillParts",(this->config).fillParts);
        this->m_needsRedraw = true;
      }
      ImGui::Separator();
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Info Panel","");
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"InfoPanel","");
      KeyBindings::getKeyNames((string *)local_98,this_01,&local_58);
      bVar15 = MenuItemWithCheckbox
                         ((string *)local_c0,(string *)local_98,&(this->config).showInfoPanel,true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      if (bVar15) {
        Confparse::WriteBool(&this->obvconfig,"showInfoPanel",(this->config).showInfoPanel);
      }
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Net List","");
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"NetList","");
      KeyBindings::getKeyNames((string *)local_98,this_01,&local_58);
      MenuItemWithCheckbox((string *)local_c0,(string *)local_98,&this->m_showNetList,true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      local_c0 = (undefined1  [8])&local_b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_c0,"Part List","");
      local_58._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"PartList","");
      KeyBindings::getKeyNames((string *)local_98,this_01,&local_58);
      MenuItemWithCheckbox((string *)local_c0,(string *)local_98,&this->m_showPartList,true);
      if ((ImVec2)local_98._0_8_ != IVar10) {
        operator_delete((void *)local_98._0_8_,CONCAT71(local_98._17_7_,local_98[0x10]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != paVar1) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      if (local_c0 != (undefined1  [8])&local_b0) {
        operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
      }
      ImGui::EndMenu();
      bVar14 = local_6c._0_1_;
    }
    bVar15 = ImGui::BeginMenu("Help##1",true);
    if (bVar15) {
      Help::Controls::menuItem(&this->helpControls);
      Help::About::menuItem(&this->helpAbout);
      ImGui::EndMenu();
    }
    ImGui::SameLine(0.0,-1.0);
    iVar16 = DPI(10);
    local_c0._4_4_ = 1.0;
    local_c0._0_4_ = (float)iVar16;
    ImGui::Dummy((ImVec2 *)local_c0);
    ImGui::SameLine(0.0,-1.0);
    v = &(this->config).showAnnotations;
    bVar15 = ImGui::Checkbox("Annotations",v);
    auVar19 = local_68;
    if (bVar15) {
      Confparse::WriteBool(&this->obvconfig,"showAnnotations",(this->config).showAnnotations);
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    bVar15 = ImGui::Checkbox("Netweb",&(this->config).showNetWeb);
    if (bVar15) {
      Confparse::WriteBool(&this->obvconfig,"showNetWeb",(this->config).showNetWeb);
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    bVar15 = ImGui::Checkbox("Pins",&(this->config).showPins);
    if (bVar15) {
      Confparse::WriteBool(&this->obvconfig,"showPins",(this->config).showPins);
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    bVar15 = ImGui::Checkbox("Image",&(this->config).showBackgroundImage);
    if (bVar15) {
      Confparse::WriteBool
                (&this->obvconfig,"showBackgroundImage",(this->config).showBackgroundImage);
      (this->backgroundImage).enabled = (this->config).showBackgroundImage;
      this->m_needsRedraw = true;
    }
    ImGui::SameLine(0.0,-1.0);
    iVar16 = DPI(0x28);
    local_c0._4_4_ = 1.0;
    local_c0._0_4_ = (float)iVar16;
    ImGui::Dummy((ImVec2 *)local_c0);
    ImGui::SameLine(0.0,-1.0);
    local_c0._0_4_ = 0.0;
    local_c0._4_4_ = 0.0;
    bVar15 = ImGui::Button(" - ",(ImVec2 *)local_c0);
    if (bVar15) {
      Zoom(this,(this->m_board_surface).x * 0.5,(this->m_board_surface).y * 0.5,
           -(this->config).zoomFactor);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c0._0_4_ = 0.0;
    local_c0._4_4_ = 0.0;
    bVar15 = ImGui::Button(" + ",(ImVec2 *)local_c0);
    if (bVar15) {
      Zoom(this,(this->m_board_surface).x * 0.5,(this->m_board_surface).y * 0.5,
           (this->config).zoomFactor);
    }
    ImGui::SameLine(0.0,-1.0);
    iVar16 = DPI(0x14);
    local_c0._4_4_ = 1.0;
    local_c0._0_4_ = (float)iVar16;
    ImGui::Dummy((ImVec2 *)local_c0);
    ImGui::SameLine(0.0,-1.0);
    local_c0._0_4_ = 0.0;
    local_c0._4_4_ = 0.0;
    bVar15 = ImGui::Button("-",(ImVec2 *)local_c0);
    if (bVar15) {
      Zoom(this,(this->m_board_surface).x * 0.5,(this->m_board_surface).y * 0.5,
           -(this->config).zoomFactor / (float)(this->config).zoomModifier);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c0._0_4_ = 0.0;
    local_c0._4_4_ = 0.0;
    bVar15 = ImGui::Button("+",(ImVec2 *)local_c0);
    if (bVar15) {
      Zoom(this,(this->m_board_surface).x * 0.5,(this->m_board_surface).y * 0.5,
           (this->config).zoomFactor / (float)(this->config).zoomModifier);
    }
    ImGui::SameLine(0.0,-1.0);
    iVar16 = DPI(0x14);
    local_c0._4_4_ = 1.0;
    local_c0._0_4_ = (float)iVar16;
    ImGui::Dummy((ImVec2 *)local_c0);
    ImGui::SameLine(0.0,-1.0);
    local_c0._0_4_ = 0.0;
    local_c0._4_4_ = 0.0;
    bVar15 = ImGui::Button(" < ",(ImVec2 *)local_c0);
    if (bVar15) {
      Rotate(this,-1);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c0._0_4_ = 0.0;
    local_c0._4_4_ = 0.0;
    bVar15 = ImGui::Button(" ^ ",(ImVec2 *)local_c0);
    if (bVar15) {
      FlipBoard(this,0);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c0._0_4_ = 0.0;
    local_c0._4_4_ = 0.0;
    bVar15 = ImGui::Button(" > ",(ImVec2 *)local_c0);
    if (bVar15) {
      Rotate(this,1);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c0._0_4_ = 0.0;
    local_c0._4_4_ = 0.0;
    bVar15 = ImGui::Button("X",(ImVec2 *)local_c0);
    if (bVar15) {
      CenterView(this);
    }
    ImGui::SameLine(0.0,-1.0);
    local_c0._0_4_ = 0.0;
    local_c0._4_4_ = 0.0;
    bVar15 = ImGui::Button("CLEAR",(ImVec2 *)local_c0);
    if (bVar15) {
      ClearAllHighlights(this);
    }
    if (((this->m_showContextMenu == true) && (this->m_file != (BRDFileBase *)0x0)) && (*v == true))
    {
      ImGui::OpenPopup("Annotations",0);
    }
    Help::About::render(&this->helpAbout);
    Help::Controls::render(&this->helpControls);
    Preferences::Program::render(&this->programPreferences);
    bVar15 = Preferences::Color::render(&this->colorPreferences);
    if (bVar15) {
      this->m_needsRedraw = true;
    }
    Preferences::Keyboard::render(&this->keyboardPreferences);
    Preferences::BoardSettings::render(&this->boardSettings);
    if ((this->m_showSearch == true) && (this->m_file != (BRDFileBase *)0x0)) {
      ImGui::OpenPopup("Search for Component / Network",0);
    }
    bVar15 = ImGui::BeginPopupModal("Error opening file",(bool *)0x0,0);
    if (bVar15) {
      ImGui::Text("There was an error opening the file: %s",
                  (this->m_lastFileOpenName)._M_dataplus._M_p);
      if ((this->m_error_msg)._M_string_length != 0) {
        ImGui::Text("%s",(this->m_error_msg)._M_dataplus._M_p);
      }
      pBVar5 = this->m_file;
      if ((pBVar5 != (BRDFileBase *)0x0) && ((pBVar5->error_msg)._M_string_length != 0)) {
        ImGui::Text("%s",(pBVar5->error_msg)._M_dataplus._M_p);
      }
      local_c0._0_4_ = 0.0;
      local_c0._4_4_ = 0.0;
      bVar15 = ImGui::Button("OK",(ImVec2 *)local_c0);
      if (bVar15) {
        ImGui::CloseCurrentPopup();
      }
      ImGui::EndPopup();
    }
    if (this->m_lastFileOpenWasInvalid == true) {
      ImGui::OpenPopup("Error opening file",0);
      this->m_lastFileOpenWasInvalid = false;
    }
    ImGui::EndMainMenuBar();
    if ((bVar14 & 1) != 0) {
LAB_00117ccb:
      std::filesystem::__cxx11::path::path((path *)local_c0);
      if (local_38 == (char (*) [2048])0x0) {
        show_file_picker_abi_cxx11_((path *)local_98,true);
        std::filesystem::__cxx11::path::operator=((path *)local_c0,(path *)local_98);
        std::filesystem::__cxx11::path::~path((path *)local_98);
        pIVar17 = ImGui::GetIO();
        pIVar17->MouseDown[0] = false;
        pIVar17->MouseClicked[0] = false;
        pIVar17->MouseClickedPos[0].x = 0.0;
        pIVar17->MouseClickedPos[0].y = 0.0;
      }
      else {
        std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
                  ((path *)local_98,(char **)&local_38,auto_format);
        std::__cxx11::string::operator=((string *)local_c0,(string *)local_98);
        p_Var13 = local_78;
        p_Var12 = local_a0;
        local_78 = (_Impl *)0x0;
        local_a0 = p_Var13;
        if (p_Var12 != (_Impl *)0x0) {
          std::filesystem::__cxx11::path::_List::_Impl_deleter::operator()
                    ((_Impl_deleter *)&local_a0,p_Var12);
        }
        std::filesystem::__cxx11::path::clear((path *)local_98);
        std::filesystem::__cxx11::path::~path((path *)local_98);
        local_38 = (char (*) [2048])0x0;
      }
      if (local_b8 != 0) {
        LoadFile(this,(path *)local_c0);
      }
      std::filesystem::__cxx11::path::~path((path *)local_c0);
    }
  }
  else {
    auVar19 = local_68;
    if ((bool)bVar14) goto LAB_00117ccb;
  }
  local_6c = DPIF(10.0);
  fVar20 = ImGui::GetFontSize();
  this->m_status_height = fVar20 + local_6c;
  local_6c = DPIF(4.0);
  local_c0._4_4_ = DPIF(3.0);
  local_c0._0_4_ = local_6c;
  ImGui::PushStyleVar(2,(ImVec2 *)local_c0);
  ImGui::PushStyleVar(3,0.0);
  ImGui::PushStyleVar(4,1.0);
  local_c0 = (undefined1  [8])
             ((ulong)(uint)(*(float *)((long)auVar19 + 0xc) - this->m_status_height) << 0x20);
  local_98._0_4_ = 0.0;
  local_98._4_4_ = 0.0;
  ImGui::SetNextWindowPos((ImVec2 *)local_c0,0,(ImVec2 *)local_98);
  local_c0._4_4_ = this->m_status_height;
  local_c0._0_4_ = *(float *)((long)auVar19 + 8);
  ImGui::SetNextWindowSize((ImVec2 *)local_c0,0);
  ImGui::Begin("status",(bool *)0x0,0x112f);
  if (((this->m_file == (BRDFileBase *)0x0) || (this->m_board == (Board *)0x0)) ||
     (peVar6 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     peVar6 == (element_type *)0x0)) {
    IVar10 = ImGui::GetMousePos();
    IVar10 = ScreenToCoord(this,IVar10.x,IVar10.y,1.0);
    unique0x10000a59 = extraout_XMM0_Dc;
    local_68._0_4_ = IVar10.x;
    local_68._4_4_ = IVar10.y;
    unique0x10000a5d = extraout_XMM0_Dd;
    if ((this->config).showFPS == true) {
      pIVar17 = ImGui::GetIO();
      ImGui::Text("FPS: %0.0f ",SUB84((double)pIVar17->Framerate,0));
      ImGui::SameLine(0.0,-1.0);
    }
    if (this->debug == true) {
      ImGui::Text("AnnID:%d ");
      ImGui::SameLine(0.0,-1.0);
    }
    if ((this->config).showPosition == true) {
      ImGui::Text("Position: %0.3f\", %0.3f\" (%0.2f, %0.2fmm)",
                  SUB84((double)((float)local_68._0_4_ / 1000.0),0),
                  (double)((float)local_68._4_4_ / 1000.0),(double)(float)local_68._0_4_ * 0.0254,
                  (double)(float)local_68._4_4_ * 0.0254);
      ImGui::SameLine(0.0,-1.0);
    }
    if (this->m_validBoard == true) {
      IVar10 = ImGui::CalcTextSize((this->fhistory).history[0],(char *)0x0,false,-1.0);
      unique0x10000a7d = extraout_XMM0_Dc_00;
      local_68._0_4_ = IVar10.x;
      local_68._4_4_ = IVar10.y;
      unique0x10000a81 = extraout_XMM0_Dd_00;
      fVar20 = ImGui::GetWindowWidth();
      ImGui::SameLine((fVar20 - (float)local_68._0_4_) + -20.0,-1.0);
      ImGui::Text("%s");
      ImGui::SameLine(0.0,-1.0);
    }
    ImGui::Text(" ");
  }
  else {
    this_02 = (this->m_pinSelected).super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_02->_M_use_count = this_02->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_02->_M_use_count = this_02->_M_use_count + 1;
      }
    }
    this_03 = (peVar6->component).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar7 = (this_03->name)._M_dataplus._M_p;
    pcVar8 = (peVar6->name)._M_dataplus._M_p;
    pcVar9 = (peVar6->net->name)._M_dataplus._M_p;
    uVar4 = *(uint *)&(peVar6->net->super_BoardElement).field_0xc;
    Component::mount_type_str_abi_cxx11_((string *)local_c0,this_03);
    ImGui::Text("Part: %s   Pin: %s   Net: %s   Probe: %d   (%s.)",pcVar7,pcVar8,pcVar9,(ulong)uVar4
                ,local_c0);
    auVar19 = local_68;
    if (local_c0 != (undefined1  [8])&local_b0) {
      operator_delete((void *)local_c0,local_b0._M_allocated_capacity + 1);
    }
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
    }
  }
  ImGui::End();
  ImGui::PopStyleVar(1);
  ImGui::PopStyleVar(1);
  ImGui::PopStyleVar(1);
  if ((this->config).showInfoPanel == false) {
    fVar21 = *(float *)((long)auVar19 + 8);
    fVar20 = *(float *)((long)auVar19 + 0xc);
  }
  else {
    fVar20 = *(float *)((long)auVar19 + 0xc);
    fVar21 = *(float *)((long)auVar19 + 8) - (this->m_info_surface).x;
  }
  fVar2 = this->m_menu_height;
  fVar3 = this->m_status_height;
  (this->m_board_surface).x = fVar21;
  (this->m_board_surface).y = fVar20 - (fVar3 + fVar2);
  local_c0 = (undefined1  [8])((ulong)(uint)fVar2 << 0x20);
  local_98._0_4_ = 0.0;
  local_98._4_4_ = 0.0;
  ImGui::SetNextWindowPos((ImVec2 *)local_c0,0,(ImVec2 *)local_98);
  if ((*(float *)((long)auVar19 + 8) == this->m_lastWidth) &&
     (!NAN(*(float *)((long)auVar19 + 8)) && !NAN(this->m_lastWidth))) {
    if ((*(float *)((long)auVar19 + 0xc) == this->m_lastHeight) &&
       (!NAN(*(float *)((long)auVar19 + 0xc)) && !NAN(this->m_lastHeight))) goto LAB_001181ac;
  }
  fVar20 = (this->m_board_surface).y;
  this->m_lastWidth = (this->m_board_surface).x;
  this->m_lastHeight = fVar20;
  this->m_needsRedraw = true;
LAB_001181ac:
  ImGui::SetNextWindowSize(&this->m_board_surface,0);
  ImGui::PushStyleVar(3,0.0);
  ImGui::PushStyleVar(4,1.0);
  ImGui::PushStyleColor(2,(this->m_colors).backgroundColor);
  ImGui::Begin("surface",(bool *)0x0,0x1313f);
  if (this->m_validBoard == true) {
    HandleInput(this);
    this_00 = &this->backgroundImage;
    draw = ImGui::GetWindowDrawList();
    fVar20 = BackgroundImage::x0(this_00);
    local_68._0_4_ = fVar20;
    dVar11 = BackgroundImage::y0(this_00,(double)CONCAT44(extraout_XMM0_Db,fVar20));
    local_c0 = (undefined1  [8])CoordToScreen(this,(float)local_68._0_4_,SUB84(dVar11,0),1.0);
    local_68._0_4_ = BackgroundImage::x1(this_00);
    dVar11 = BackgroundImage::y1(this_00,(double)CONCAT44(extraout_XMM0_Db_00,local_68._0_4_));
    local_98._0_8_ = CoordToScreen(this,(float)local_68._0_4_,SUB84(dVar11,0),1.0);
    BackgroundImage::render(this_00,draw,(ImVec2 *)local_c0,(ImVec2 *)local_98,this->m_rotation);
    DrawBoard(this);
  }
  ImGui::End();
  ImGui::PopStyleColor(1);
  ImGui::PopStyleVar(1);
  RenderOverlay(this);
  ImGui::PopStyleVar(1);
  HandlePDFBridgeSelection(this);
  return;
}

Assistant:

void BoardView::Update() {
	bool open_file = false;
	// ImGuiIO &io = ImGui::GetIO();
	char *preset_filename = NULL;
	ImGuiIO &io           = ImGui::GetIO();

	// Window is probably minimized, do not attempt to draw anything as our code will not handle screen size of 0 properly and crash (ocornut/imgui@bb2529d)
	if (io.DisplaySize.x <= 0.0f || io.DisplaySize.y <= 0.0f) {
		return;
	}

	/**
	 * ** FIXME
	 * This should be handled in the keyboard section, not here
	 */
	if (keybindings.isPressed("Open")) {
		open_file = true;
		// the dialog will likely eat our WM_KEYUP message for CTRL and O:
		io.AddKeyEvent(ImGuiKey_RightCtrl, false);
		io.AddKeyEvent(ImGuiKey_LeftCtrl, false);
		io.AddKeyEvent(ImGuiKey_O, false);

	}

	if (keybindings.isPressed("Quit")) {
		m_wantsQuit = true;
	}

	if (ImGui::BeginMainMenuBar()) {
		m_menu_height = ImGui::GetWindowHeight();

		/*
		 * Create these dialogs, but they're not actually
		 * visible until they're called up by the respective
		 * flags.
		 */
		SearchComponent();
		ContextMenu();

		if (ImGui::BeginMenu("File")) {
			if (ImGui::MenuItem("Open", keybindings.getKeyNames("Open").c_str())) {
				open_file = true;
			}

			/// Generate file history - PLD20160618-2028
			ImGui::Separator();
			{
				int i;
				for (i = 0; i < fhistory.count; i++) {
					if (ImGui::MenuItem(fhistory.Trim_filename(fhistory.history[i], 2))) {
						open_file       = true;
						preset_filename = fhistory.history[i];
					}
				}
			}
			ImGui::Separator();

			if (ImGui::MenuItem("Part/Net Search", keybindings.getKeyNames("Search").c_str())) {
				if (m_validBoard) m_showSearch = true;
			}

			ImGui::Separator();

			programPreferences.menuItem();
			colorPreferences.menuItem();
			keyboardPreferences.menuItem();
			boardSettings.menuItem();

			ImGui::Separator();

			if (ImGui::MenuItem("Quit", keybindings.getKeyNames("Quit").c_str())) {
				m_wantsQuit = true;
			}
			ImGui::EndMenu();
		}
		if (ImGui::BeginMenu("View")) {
			if (ImGui::MenuItem("Flip board", keybindings.getKeyNames("Flip").c_str())) {
				FlipBoard();
			}
			if (ImGui::MenuItem("Rotate CW", keybindings.getKeyNames("RotateCW").c_str())) {
				Rotate(1);
			}
			if (ImGui::MenuItem("Rotate CCW", keybindings.getKeyNames("RotateCCW").c_str())) {
				Rotate(-1);
			}
			if (ImGui::MenuItem("Reset View", keybindings.getKeyNames("Center").c_str())) {
				CenterView();
			}
			if (ImGui::MenuItem("Mirror Board", keybindings.getKeyNames("Mirror").c_str())) {
				Mirror();
			}

			ImGui::Separator();
			if (MenuItemWithCheckbox("Show FPS", {}, config.showFPS)) {
				obvconfig.WriteBool("showFPS", config.showFPS);
			}

			if (MenuItemWithCheckbox("Show position", {}, config.showPosition)) {
				obvconfig.WriteBool("showPosition", config.showPosition);
			}

			if (MenuItemWithCheckbox("Show pins", keybindings.getKeyNames("TogglePins"), config.showPins)) {
				obvconfig.WriteBool("showPins", config.showPins);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show net web", {}, config.showNetWeb)) {
				obvconfig.WriteBool("showNetWeb", config.showNetWeb);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show annotations", {}, config.showAnnotations)) {
				obvconfig.WriteBool("showAnnotations", config.showAnnotations);
				m_needsRedraw = true;
			}


			if (MenuItemWithCheckbox("Show parts name", {}, config.showPartName)) {
				obvconfig.WriteBool("showPartName", config.showPartName);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show pins name", {}, config.showPinName)) {
				obvconfig.WriteBool("showPinName", config.showPinName);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Show background image", {}, config.showBackgroundImage)) {
				obvconfig.WriteBool("showBackgroundImage", config.showBackgroundImage);
				backgroundImage.enabled = config.showBackgroundImage;
			}

			if (MenuItemWithCheckbox("Fill board", {}, config.boardFill)) {
				obvconfig.WriteBool("boardFill", config.boardFill);
				m_needsRedraw = true;
			}

			if (MenuItemWithCheckbox("Fill parts", {}, config.fillParts)) {
				obvconfig.WriteBool("fillParts", config.fillParts);
				m_needsRedraw = true;
			}

			ImGui::Separator();

			if (MenuItemWithCheckbox("Info Panel", keybindings.getKeyNames("InfoPanel"), config.showInfoPanel)) {
				obvconfig.WriteBool("showInfoPanel", config.showInfoPanel);
			}
			MenuItemWithCheckbox("Net List", keybindings.getKeyNames("NetList"), m_showNetList);
			MenuItemWithCheckbox("Part List", keybindings.getKeyNames("PartList"), m_showPartList);

			ImGui::EndMenu();
		}

		if (ImGui::BeginMenu("Help##1")) {
			helpControls.menuItem();
			helpAbout.menuItem();

			ImGui::EndMenu();
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(10), 1));
		ImGui::SameLine();
		if (ImGui::Checkbox("Annotations", &config.showAnnotations)) {
			obvconfig.WriteBool("showAnnotations", config.showAnnotations);
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		if (ImGui::Checkbox("Netweb", &config.showNetWeb)) {
			obvconfig.WriteBool("showNetWeb", config.showNetWeb);
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		{
			if (ImGui::Checkbox("Pins", &config.showPins)) {
				obvconfig.WriteBool("showPins", config.showPins);
				m_needsRedraw = true;
			}
		}

		ImGui::SameLine();
		if (ImGui::Checkbox("Image", &config.showBackgroundImage)) {
			obvconfig.WriteBool("showBackgroundImage", config.showBackgroundImage);
			backgroundImage.enabled = config.showBackgroundImage;
			m_needsRedraw = true;
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(40), 1));

		ImGui::SameLine();
		if (ImGui::Button(" - ")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor);
		}
		ImGui::SameLine();
		if (ImGui::Button(" + ")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor);
		}
		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(20), 1));
		ImGui::SameLine();
		if (ImGui::Button("-")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, -config.zoomFactor / config.zoomModifier);
		}
		ImGui::SameLine();
		if (ImGui::Button("+")) {
			Zoom(m_board_surface.x / 2, m_board_surface.y / 2, config.zoomFactor / config.zoomModifier);
		}

		ImGui::SameLine();
		ImGui::Dummy(ImVec2(DPI(20), 1));
		ImGui::SameLine();
		if (ImGui::Button(" < ")) {
			Rotate(-1);
		}

		ImGui::SameLine();
		if (ImGui::Button(" ^ ")) {
			FlipBoard();
		}

		ImGui::SameLine();
		if (ImGui::Button(" > ")) {
			Rotate(1);
		}

		ImGui::SameLine();
		if (ImGui::Button("X")) {
			CenterView();
		}

		ImGui::SameLine();
		if (ImGui::Button("CLEAR")) {
			ClearAllHighlights();
		}

		/*
		ImGui::SameLine();
		ImVec2 tz = ImGui::CalcTextSize("Search             ");
		ImGui::PushItemWidth(-tz.x);
		ImGui::Text("Search");
		ImGui::SameLine();
		ImGui::PushItemWidth(-DPI(1));
		if (ImGui::InputText("##ansearch", m_search, 128, 0)) {
		}
		ImGui::PopItemWidth();
		*/

		if (m_showContextMenu && m_file && config.showAnnotations) {
			ImGui::OpenPopup("Annotations");
		}

		helpAbout.render();
		helpControls.render();

		programPreferences.render();

		if (colorPreferences.render()) {
			m_needsRedraw = true;
		};

		keyboardPreferences.render();
		boardSettings.render();

		if (m_showSearch && m_file) {
			ImGui::OpenPopup("Search for Component / Network");
		}

		if (ImGui::BeginPopupModal("Error opening file")) {
			ImGui::Text("There was an error opening the file: %s", m_lastFileOpenName.c_str());
			if (!m_error_msg.empty()) {
				ImGui::Text("%s", m_error_msg.c_str());
			}
			if (m_file && !m_file->error_msg.empty()) {
				ImGui::Text("%s", m_file->error_msg.c_str());
			}
			if (ImGui::Button("OK")) {
				ImGui::CloseCurrentPopup();
			}
			ImGui::EndPopup();
		}
		if (m_lastFileOpenWasInvalid) {
			ImGui::OpenPopup("Error opening file");
			m_lastFileOpenWasInvalid = false;
		}
		ImGui::EndMainMenuBar();
	}

	if (open_file) {
		filesystem::path filepath;

		if (preset_filename) {
			filepath        = filesystem::u8path(preset_filename);
			preset_filename = NULL;
		} else {
			filepath = show_file_picker(true);

			ImGuiIO &io           = ImGui::GetIO();
			io.MouseDown[0]       = false;
			io.MouseClicked[0]    = false;
			io.MouseClickedPos[0] = ImVec2(0, 0);
		}

		if (!filepath.empty()) {
			LoadFile(filepath);
		}
	}

	ImGuiWindowFlags flags = ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove |
	                         ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings;

	// ImGui's keyboard navigation is disabled for the boardview area as we use our own key bindings
	ImGuiWindowFlags draw_surface_flags = flags | ImGuiWindowFlags_NoFocusOnAppearing | ImGuiWindowFlags_NoBringToFrontOnFocus |
		ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_NoNavInputs;

	/*
	 * Status footer
	 */
	m_status_height = (DPIF(10.0f) + ImGui::GetFontSize());
	ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(DPIF(4.0f), DPIF(3.0f)));
	ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::SetNextWindowPos(ImVec2(0, io.DisplaySize.y - m_status_height));
	ImGui::SetNextWindowSize(ImVec2(io.DisplaySize.x, m_status_height));
	ImGui::Begin("status", nullptr, flags | ImGuiWindowFlags_NoFocusOnAppearing);
	if (m_file && m_board && m_pinSelected) {
		auto pin = m_pinSelected;
		ImGui::Text("Part: %s   Pin: %s   Net: %s   Probe: %d   (%s.)",
		            pin->component->name.c_str(),
		            pin->name.c_str(),
		            pin->net->name.c_str(),
		            pin->net->number,
		            pin->component->mount_type_str().c_str());
	} else {
		ImVec2 spos = ImGui::GetMousePos();
		ImVec2 pos  = ScreenToCoord(spos.x, spos.y);
		if (config.showFPS == true) {
			ImGui::Text("FPS: %0.0f ", ImGui::GetIO().Framerate);
			ImGui::SameLine();
		}

		if (debug) {
			ImGui::Text("AnnID:%d ", m_annotation_clicked_id);
			ImGui::SameLine();
		}

		if (config.showPosition == true) {
			ImGui::Text("Position: %0.3f\", %0.3f\" (%0.2f, %0.2fmm)", pos.x / 1000, pos.y / 1000, pos.x * 0.0254, pos.y * 0.0254);
			ImGui::SameLine();
		}

		{
			if (m_validBoard) {
				ImVec2 s = ImGui::CalcTextSize(fhistory.history[0]);
				ImGui::SameLine(ImGui::GetWindowWidth() - s.x - 20);
				ImGui::Text("%s", fhistory.history[0]);
				ImGui::SameLine();
			}
		}
		ImGui::Text(" ");
	}
	ImGui::End();
	ImGui::PopStyleVar();
	ImGui::PopStyleVar();
	ImGui::PopStyleVar();

	if (!config.showInfoPanel) {
		m_board_surface = ImVec2(io.DisplaySize.x, io.DisplaySize.y - (m_status_height + m_menu_height));
	} else {
		m_board_surface = ImVec2(io.DisplaySize.x - m_info_surface.x, io.DisplaySize.y - (m_status_height + m_menu_height));
	}
	/*
	 * Drawing surface, where the actual PCB/board is plotted out
	 */
	ImGui::SetNextWindowPos(ImVec2(0, m_menu_height));
	if (io.DisplaySize.x != m_lastWidth || io.DisplaySize.y != m_lastHeight) {
		//		m_lastWidth   = io.DisplaySize.x;
		//		m_lastHeight  = io.DisplaySize.y;
		m_lastWidth   = m_board_surface.x;
		m_lastHeight  = m_board_surface.y;
		m_needsRedraw = true;
	}

	ImGui::SetNextWindowSize(m_board_surface);

	ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
	ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 1.0f);
	ImGui::PushStyleColor(ImGuiCol_WindowBg, m_colors.backgroundColor);

	ImGui::Begin("surface", nullptr, draw_surface_flags);
	if (m_validBoard) {
		HandleInput();
		backgroundImage.render(*ImGui::GetWindowDrawList(),
			CoordToScreen(backgroundImage.x0(), backgroundImage.y0()),
			CoordToScreen(backgroundImage.x1(), backgroundImage.y1()),
			m_rotation);
		DrawBoard();
	}
	ImGui::End();
	ImGui::PopStyleColor();
	ImGui::PopStyleVar();

	// Overlay
	RenderOverlay();

	ImGui::PopStyleVar();

	HandlePDFBridgeSelection();

}